

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validators_inl.hpp
# Opt level: O0

Validator * __thiscall
CLI::Validator::description
          (Validator *__return_storage_ptr__,Validator *this,string *validator_desc)

{
  anon_class_32_1_5ff8519c local_48;
  undefined1 local_21;
  string *local_20;
  string *validator_desc_local;
  Validator *this_local;
  Validator *newval;
  
  local_21 = 0;
  local_20 = validator_desc;
  validator_desc_local = (string *)this;
  this_local = __return_storage_ptr__;
  Validator(__return_storage_ptr__,this);
  ::std::__cxx11::string::string((string *)&local_48,(string *)validator_desc);
  ::std::function<std::__cxx11::string()>::operator=
            ((function<std::__cxx11::string()> *)__return_storage_ptr__,&local_48);
  const::{lambda()#1}::~basic_string((_lambda___1_ *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE Validator Validator::description(std::string validator_desc) const {
    Validator newval(*this);
    newval.desc_function_ = [validator_desc]() { return validator_desc; };
    return newval;
}